

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_type.cpp
# Opt level: O1

pair<bool,_node_type> string_to_node(string *string)

{
  pair<bool,_node_type> pVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>
  __l;
  allocator_type local_22f;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_22e;
  node_type local_22d [13];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_180;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
  local_40;
  
  if (string_to_node(std::__cxx11::string)::table_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&string_to_node(std::__cxx11::string)::table_abi_cxx11_);
    if (iVar2 != 0) {
      local_22d[0xc] = 1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[2],_node_type,_true>(&local_220,(char (*) [2])"D",local_22d + 0xc);
      local_22d[0xb] = 2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_1f8,(char (*) [3])"P0",local_22d + 0xb);
      local_22d[10] = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_1d0,(char (*) [3])"I1",local_22d + 10);
      local_22d[9] = 4;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_1a8,(char (*) [3])"P1",local_22d + 9);
      local_22d[8] = 5;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_180,(char (*) [3])"I2",local_22d + 8);
      local_22d[7] = 6;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_158,(char (*) [3])"P2",local_22d + 7);
      local_22d[6] = 7;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_130,(char (*) [3])"I3",local_22d + 6);
      local_22d[5] = 8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_108,(char (*) [3])"P3",local_22d + 5);
      local_22d[4] = 9;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_e0,(char (*) [3])"I4",local_22d + 4);
      local_22d[3] = 10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_b8,(char (*) [3])"P4",local_22d + 3);
      local_22d[2] = 0xb;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_90,(char (*) [3])"P5",local_22d + 2);
      local_22d[1] = 0xc;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_68,(char (*) [3])"P6",local_22d + 1);
      local_22d[0] = P7;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>
      ::pair<const_char_(&)[3],_node_type,_true>(&local_40,(char (*) [3])"P7",local_22d);
      __l._M_len = 0xd;
      __l._M_array = &local_220;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>_>
      ::map(&string_to_node(std::__cxx11::string)::table_abi_cxx11_,__l,&local_22e,&local_22f);
      lVar5 = -0x208;
      paVar6 = &local_40.first.field_2;
      do {
        if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar6->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],
                          paVar6->_M_allocated_capacity + 1);
        }
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar6->_M_allocated_capacity + -5);
        lVar5 = lVar5 + 0x28;
      } while (lVar5 != 0);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>_>
                   ::~map,&string_to_node(std::__cxx11::string)::table_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&string_to_node(std::__cxx11::string)::table_abi_cxx11_);
    }
  }
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>_>
          ::find(&string_to_node(std::__cxx11::string)::table_abi_cxx11_._M_t,string);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &string_to_node(std::__cxx11::string)::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    pVar1.first = false;
    pVar1.second = 0;
  }
  else {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_node_type>_>_>
             ::operator[](&string_to_node(std::__cxx11::string)::table_abi_cxx11_,string);
    pVar1 = (pair<bool,_node_type>)((ushort)*pmVar4 * 0x100 + 1);
  }
  return pVar1;
}

Assistant:

std::pair<bool, node_type> string_to_node(std::string string)
{
    static std::map<std::string, node_type> table = {
        {"D", D},
        {"P0", P0},
        {"I1", I1},
        {"P1", P1},
        {"I2", I2},
        {"P2", P2},
        {"I3", I3},
        {"P3", P3},
        {"I4", I4},
        {"P4", P4},
        {"P5", P5},
        {"P6", P6},
        {"P7", P7},
    };

    std::pair<bool, node_type> pair;
    if(table.find(string) == table.end())
    {
        pair.first = false;
    }
    else
    {
        pair.first = true;
        pair.second = table[string];
    }
    
    return pair;
}